

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::SerializeWithCachedSizes
          (ItemSimilarityRecommender_ConnectedItem *this,CodedOutputStream *output)

{
  double value;
  
  if (this->itemid_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->itemid_,output);
  }
  value = this->similarityscore_;
  if ((value == 0.0) && (!NAN(value))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble(2,value,output);
  return;
}

Assistant:

void ItemSimilarityRecommender_ConnectedItem::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ItemSimilarityRecommender.ConnectedItem)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 itemId = 1;
  if (this->itemid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->itemid(), output);
  }

  // double similarityScore = 2;
  if (this->similarityscore() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->similarityscore(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ItemSimilarityRecommender.ConnectedItem)
}